

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm.hpp
# Opt level: O3

rgb __thiscall baryonyx::colormap::operator()(colormap *this,double v_)

{
  float fVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  uint uVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar7 [64];
  float fVar8;
  
  auVar7._8_56_ = in_register_00001208;
  auVar7._0_8_ = v_;
  fVar5 = this->m_lower;
  auVar6._0_4_ = (float)v_;
  auVar6._4_12_ = auVar7._4_12_;
  auVar6 = vmaxss_avx(ZEXT416((uint)fVar5),auVar6);
  auVar6 = vminss_avx(ZEXT416((uint)this->m_upper),auVar6);
  fVar1 = this->m_upper - fVar5;
  auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3e800000),0),ZEXT416((uint)fVar1),ZEXT416((uint)fVar5))
  ;
  fVar8 = auVar6._0_4_;
  if (auVar2._0_4_ <= fVar8) {
    auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)fVar1),
                             ZEXT416((uint)fVar5));
    if (auVar6._0_4_ <= fVar8) {
      auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f400000),0),ZEXT416((uint)fVar1),
                               ZEXT416((uint)fVar5));
      if (auVar6._0_4_ <= fVar8) {
        bVar3 = 0xff;
        fVar5 = ((auVar6._0_4_ - fVar8) * 4.0) / fVar1 + 1.0;
      }
      else {
        auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 - fVar5)),ZEXT416((uint)fVar1),
                                 ZEXT416(0xbf000000));
        bVar3 = (byte)(int)(((auVar6._0_4_ * 4.0) / fVar1) * 255.0);
        fVar5 = 1.0;
      }
      uVar4 = 0;
    }
    else {
      bVar3 = 0;
      fVar5 = 1.0;
      uVar4 = (uint)((((auVar2._0_4_ - fVar8) * 4.0) / fVar1 + 1.0) * 255.0);
    }
  }
  else {
    uVar4 = 0xff;
    bVar3 = 0;
    fVar5 = ((fVar8 - fVar5) * 4.0) / fVar1;
  }
  return (rgb)((uint3)bVar3 |
              (uint3)(((int)(fVar5 * 255.0) & 0xffU) << 8) | (uint3)((uVar4 & 0xff) << 0x10));
}

Assistant:

rgb operator()(T v_) noexcept
    {
        float v = static_cast<float>(v_);

        if (v < m_lower)
            v = m_lower;

        if (v > m_upper)
            v = m_upper;

        float dv = m_upper - m_lower;
        float r = 1.f, g = 1.f, b = 1.f;

        if (v < (m_lower + 0.25f * dv)) {
            r = 0.f;
            g = 4.f * (v - m_lower) / dv;
        } else if (v < (m_lower + 0.5f * dv)) {
            r = 0.f;
            b = 1.f + 4.f * (m_lower + 0.25f * dv - v) / dv;
        } else if (v < (m_lower + 0.75f * dv)) {
            r = 4.f * (v - m_lower - 0.5f * dv) / dv;
            b = 0.f;
        } else {
            g = 1.f + 4.f * (m_lower + 0.75f * dv - v) / dv;
            b = 0.f;
        }

        return rgb(static_cast<std::uint8_t>(r * 255.f),
                   static_cast<std::uint8_t>(g * 255.f),
                   static_cast<std::uint8_t>(b * 255.f));
    }